

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_t.cpp
# Opt level: O3

void __thiscall deci::string_t::string_t(string_t *this,string *copy)

{
  pointer pcVar1;
  
  (this->super_value_t).hash = 1;
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_0010fd58;
  (this->val)._M_dataplus._M_p = (pointer)&(this->val).field_2;
  pcVar1 = (copy->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->val,pcVar1,pcVar1 + copy->_M_string_length);
  return;
}

Assistant:

string_t::string_t(const std::string& copy):value_t(),val(copy) {
      ;
    }